

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa_common.h
# Opt level: O2

void play_floatbuffer(snd_pcm_t *device,snd_pcm_format_t format,size_t period_size,float preamp,
                     float *buffer,void *alsabuffer)

{
  float fVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  undefined2 uVar6;
  FILE *__stream;
  
  if (((format != SND_PCM_FORMAT_FLOAT) || (preamp != 1.0)) || (NAN(preamp))) {
    if (format == SND_PCM_FORMAT_S16) {
      for (lVar5 = 0; period_size * 2 != lVar5; lVar5 = lVar5 + 1) {
        fVar1 = buffer[lVar5] * preamp;
        uVar6 = 0x7fff;
        if ((fVar1 <= 1.0) && (uVar6 = 0x8001, -1.0 <= fVar1)) {
          uVar6 = (undefined2)(int)(fVar1 * 32767.0);
        }
        *(undefined2 *)((long)alsabuffer + lVar5 * 2) = uVar6;
      }
    }
    else if (format == SND_PCM_FORMAT_S32) {
      for (lVar5 = 0; period_size * 2 != lVar5; lVar5 = lVar5 + 1) {
        fVar1 = buffer[lVar5] * preamp;
        iVar2 = 0x7fffffff;
        if ((fVar1 <= 1.0) && (iVar2 = -0x7fffffff, -1.0 <= fVar1)) {
          iVar2 = (int)(fVar1 * 2.1474836e+09);
        }
        *(int *)((long)alsabuffer + lVar5 * 4) = iVar2;
      }
    }
    else if (format == SND_PCM_FORMAT_FLOAT) {
      for (lVar5 = 0; period_size * 2 != lVar5; lVar5 = lVar5 + 1) {
        *(float *)((long)alsabuffer + lVar5 * 4) = buffer[lVar5] * preamp;
      }
    }
    iVar2 = snd_pcm_writei(device,alsabuffer);
    if (iVar2 < 0) {
      iVar2 = snd_pcm_recover(device,iVar2,0);
      __stream = _stderr;
      if (iVar2 < 0) {
        uVar3 = snd_strerror(iVar2);
        uVar4 = 0xc1;
        goto LAB_00102eb6;
      }
    }
  }
  else {
    iVar2 = snd_pcm_writei(device,buffer);
    if (iVar2 < 0) {
      iVar2 = snd_pcm_recover(device,iVar2,0);
      __stream = _stderr;
      if (iVar2 < 0) {
        uVar3 = snd_strerror(iVar2);
        uVar4 = 0xaf;
LAB_00102eb6:
        fprintf(__stream,"%s(%i) ALSA internal error : %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Artefact2[P]libxm/examples/alsa_common.h"
                ,uVar4,uVar3);
        fflush(_stderr);
        exit(1);
      }
    }
  }
  return;
}

Assistant:

void play_floatbuffer(snd_pcm_t* device, snd_pcm_format_t format, size_t period_size, float preamp,
                   float* buffer, void* alsabuffer) {
	if(format == SND_PCM_FORMAT_FLOAT && preamp == 1.f) {
		CHECK_ALSA_CALL(snd_pcm_writei(device, buffer, period_size));
	} else {
		const unsigned int channels = 2;

		if(format == SND_PCM_FORMAT_S16) {
			for(size_t i = 0; i < period_size * channels; ++i) {
				((int16_t*)alsabuffer)[i] = (int16_t)(CLAMP((double)buffer[i] * preamp) * 32767.);
			}
		} else if(format == SND_PCM_FORMAT_S32) {
			for(size_t i = 0; i < period_size * channels; ++i) {
				((int32_t*)alsabuffer)[i] = (int32_t)(CLAMP((double)buffer[i] * preamp) * 2147483647.);
			}
		} else if(format == SND_PCM_FORMAT_FLOAT) {
			for(size_t i = 0; i < period_size * channels; ++i) {
				((float*)alsabuffer)[i] = buffer[i] * preamp;
			}
		}

		CHECK_ALSA_CALL(snd_pcm_writei(device, alsabuffer, period_size));
	}
}